

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spherei_intersector.h
# Opt level: O2

bool embree::avx::SphereMiIntersectorK<4,_4,_true>::occluded
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *sphere)

{
  undefined4 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  Geometry *pGVar5;
  long lVar6;
  __int_type_conflict _Var7;
  RTCFilterFunctionN p_Var8;
  ulong uVar9;
  uint uVar10;
  byte bVar11;
  bool bVar12;
  undefined1 (*pauVar13) [16];
  Scene *pSVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar24;
  float fVar31;
  float fVar32;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar33;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [64];
  undefined1 auVar38 [16];
  undefined1 auVar39 [64];
  undefined1 auVar40 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [64];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [64];
  undefined1 auVar48 [16];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar54;
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 local_228 [16];
  undefined1 (*local_218) [16];
  Primitive *local_210;
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  Scene *local_1e0;
  RTCFilterFunctionNArguments args;
  SphereIntersectorHitM<4> hit;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [32];
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  undefined1 local_68 [16];
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  uint uStack_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  undefined1 auVar41 [64];
  undefined1 auVar55 [64];
  
  pSVar14 = context->scene;
  pGVar5 = (pSVar14->geometries).items[sphere->sharedGeomID].ptr;
  lVar6 = *(long *)&pGVar5->field_0x58;
  _Var7 = pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar25 = *(undefined1 (*) [16])(lVar6 + (sphere->primIDs).field_0.i[0] * _Var7);
  auVar19 = *(undefined1 (*) [16])(lVar6 + (sphere->primIDs).field_0.i[1] * _Var7);
  auVar42 = *(undefined1 (*) [16])(lVar6 + (sphere->primIDs).field_0.i[2] * _Var7);
  auVar23 = *(undefined1 (*) [16])(lVar6 + (sphere->primIDs).field_0.i[3] * _Var7);
  auVar34 = vunpcklps_avx(auVar25,auVar42);
  auVar25 = vunpckhps_avx(auVar25,auVar42);
  auVar42 = vunpcklps_avx(auVar19,auVar23);
  auVar19 = vunpckhps_avx(auVar19,auVar23);
  auVar23 = vunpcklps_avx(auVar34,auVar42);
  auVar42 = vunpckhps_avx(auVar34,auVar42);
  auVar16 = vunpcklps_avx(auVar25,auVar19);
  auVar27 = vunpckhps_avx(auVar25,auVar19);
  auVar25 = vpshufd_avx(ZEXT116(sphere->numPrimitives),0);
  auVar19 = vpcmpgtd_avx(auVar25,_DAT_01f4ad30);
  local_d8 = vpshufd_avx(ZEXT416(sphere->sharedGeomID),0);
  uVar1 = *(undefined4 *)(ray + k * 4);
  auVar38._4_4_ = uVar1;
  auVar38._0_4_ = uVar1;
  auVar38._8_4_ = uVar1;
  auVar38._12_4_ = uVar1;
  auVar23 = vsubps_avx(auVar23,auVar38);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x10);
  auVar34._4_4_ = uVar1;
  auVar34._0_4_ = uVar1;
  auVar34._8_4_ = uVar1;
  auVar34._12_4_ = uVar1;
  auVar34 = vsubps_avx(auVar42,auVar34);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
  auVar25._4_4_ = uVar1;
  auVar25._0_4_ = uVar1;
  auVar25._8_4_ = uVar1;
  auVar25._12_4_ = uVar1;
  auVar16 = vsubps_avx(auVar16,auVar25);
  fVar2 = *(float *)(ray + k * 4 + 0x40);
  auVar50 = ZEXT1664(CONCAT412(fVar2,CONCAT48(fVar2,CONCAT44(fVar2,fVar2))));
  fVar3 = *(float *)(ray + k * 4 + 0x50);
  auVar51 = ZEXT1664(CONCAT412(fVar3,CONCAT48(fVar3,CONCAT44(fVar3,fVar3))));
  fVar4 = *(float *)(ray + k * 4 + 0x60);
  auVar52 = ZEXT1664(CONCAT412(fVar4,CONCAT48(fVar4,CONCAT44(fVar4,fVar4))));
  auVar25 = ZEXT416((uint)(fVar2 * fVar2 + fVar3 * fVar3 + fVar4 * fVar4));
  auVar42 = vshufps_avx(auVar25,auVar25,0);
  auVar25 = vrcpps_avx(auVar42);
  fVar24 = auVar25._0_4_;
  auVar26._0_4_ = fVar24 * auVar42._0_4_;
  fVar31 = auVar25._4_4_;
  auVar26._4_4_ = fVar31 * auVar42._4_4_;
  fVar32 = auVar25._8_4_;
  auVar26._8_4_ = fVar32 * auVar42._8_4_;
  fVar33 = auVar25._12_4_;
  auVar26._12_4_ = fVar33 * auVar42._12_4_;
  auVar42._8_4_ = 0x3f800000;
  auVar42._0_8_ = 0x3f8000003f800000;
  auVar42._12_4_ = 0x3f800000;
  auVar25 = vsubps_avx(auVar42,auVar26);
  fVar24 = fVar24 + fVar24 * auVar25._0_4_;
  fVar31 = fVar31 + fVar31 * auVar25._4_4_;
  fVar32 = fVar32 + fVar32 * auVar25._8_4_;
  fVar33 = fVar33 + fVar33 * auVar25._12_4_;
  auVar35._0_4_ = (fVar2 * auVar23._0_4_ + fVar3 * auVar34._0_4_ + fVar4 * auVar16._0_4_) * fVar24;
  auVar35._4_4_ = (fVar2 * auVar23._4_4_ + fVar3 * auVar34._4_4_ + fVar4 * auVar16._4_4_) * fVar31;
  auVar35._8_4_ = (fVar2 * auVar23._8_4_ + fVar3 * auVar34._8_4_ + fVar4 * auVar16._8_4_) * fVar32;
  auVar35._12_4_ =
       (fVar2 * auVar23._12_4_ + fVar3 * auVar34._12_4_ + fVar4 * auVar16._12_4_) * fVar33;
  auVar43._0_4_ = fVar2 * auVar35._0_4_;
  auVar43._4_4_ = fVar2 * auVar35._4_4_;
  auVar43._8_4_ = fVar2 * auVar35._8_4_;
  auVar43._12_4_ = fVar2 * auVar35._12_4_;
  auVar45._0_4_ = fVar3 * auVar35._0_4_;
  auVar45._4_4_ = fVar3 * auVar35._4_4_;
  auVar45._8_4_ = fVar3 * auVar35._8_4_;
  auVar45._12_4_ = fVar3 * auVar35._12_4_;
  auVar48._0_4_ = fVar4 * auVar35._0_4_;
  auVar48._4_4_ = fVar4 * auVar35._4_4_;
  auVar48._8_4_ = fVar4 * auVar35._8_4_;
  auVar48._12_4_ = fVar4 * auVar35._12_4_;
  auVar42 = vsubps_avx(auVar23,auVar43);
  auVar44 = ZEXT1664(auVar42);
  auVar23 = vsubps_avx(auVar34,auVar45);
  auVar47 = ZEXT1664(auVar23);
  auVar34 = vsubps_avx(auVar16,auVar48);
  auVar49 = ZEXT1664(auVar34);
  auVar20._0_4_ =
       auVar42._0_4_ * auVar42._0_4_ + auVar23._0_4_ * auVar23._0_4_ + auVar34._0_4_ * auVar34._0_4_
  ;
  auVar20._4_4_ =
       auVar42._4_4_ * auVar42._4_4_ + auVar23._4_4_ * auVar23._4_4_ + auVar34._4_4_ * auVar34._4_4_
  ;
  auVar20._8_4_ =
       auVar42._8_4_ * auVar42._8_4_ + auVar23._8_4_ * auVar23._8_4_ + auVar34._8_4_ * auVar34._8_4_
  ;
  auVar20._12_4_ =
       auVar42._12_4_ * auVar42._12_4_ +
       auVar23._12_4_ * auVar23._12_4_ + auVar34._12_4_ * auVar34._12_4_;
  auVar18._0_4_ = auVar27._0_4_ * auVar27._0_4_;
  auVar18._4_4_ = auVar27._4_4_ * auVar27._4_4_;
  auVar18._8_4_ = auVar27._8_4_ * auVar27._8_4_;
  auVar18._12_4_ = auVar27._12_4_ * auVar27._12_4_;
  auVar25 = vcmpps_avx(auVar20,auVar18,2);
  auVar16 = auVar19 & auVar25;
  if ((((auVar16 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar16 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar16 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar16[0xf] < '\0') {
    auVar25 = vandps_avx(auVar25,auVar19);
    auVar19 = vsubps_avx(auVar18,auVar20);
    auVar16._0_4_ = fVar24 * auVar19._0_4_;
    auVar16._4_4_ = fVar31 * auVar19._4_4_;
    auVar16._8_4_ = fVar32 * auVar19._8_4_;
    auVar16._12_4_ = fVar33 * auVar19._12_4_;
    auVar18 = vsqrtps_avx(auVar16);
    auVar56 = ZEXT1664(auVar18);
    auVar26 = vsubps_avx(auVar35,auVar18);
    auVar53._0_4_ = auVar18._0_4_ + auVar35._0_4_;
    auVar53._4_4_ = auVar18._4_4_ + auVar35._4_4_;
    auVar53._8_4_ = auVar18._8_4_ + auVar35._8_4_;
    auVar53._12_4_ = auVar18._12_4_ + auVar35._12_4_;
    auVar55 = ZEXT1664(auVar53);
    uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
    auVar27._4_4_ = uVar1;
    auVar27._0_4_ = uVar1;
    auVar27._8_4_ = uVar1;
    auVar27._12_4_ = uVar1;
    auVar19 = vcmpps_avx(auVar27,auVar26,2);
    uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar40._4_4_ = uVar1;
    auVar40._0_4_ = uVar1;
    auVar40._8_4_ = uVar1;
    auVar40._12_4_ = uVar1;
    auVar41 = ZEXT1664(auVar40);
    auVar16 = vcmpps_avx(auVar26,auVar40,2);
    auVar19 = vandps_avx(auVar16,auVar19);
    auVar57 = ZEXT1664(auVar19);
    auVar19 = vandps_avx(auVar19,auVar25);
    auVar16 = vcmpps_avx(auVar27,auVar53,2);
    auVar27 = vcmpps_avx(auVar53,auVar40,2);
    auVar16 = vandps_avx(auVar16,auVar27);
    auVar25 = vandps_avx(auVar16,auVar25);
    auVar37 = ZEXT1664(auVar25);
    auVar25 = vorps_avx(auVar19,auVar25);
    uVar10 = vmovmskps_avx(auVar25);
    if (uVar10 != 0) {
      hit.vt.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar53,auVar26,auVar19);
      auVar28._0_8_ = auVar18._0_8_ ^ 0x8000000080000000;
      auVar28._8_4_ = -auVar18._8_4_;
      auVar28._12_4_ = -auVar18._12_4_;
      auVar25 = vblendvps_avx(auVar18,auVar28,auVar19);
      fVar24 = auVar25._0_4_;
      auVar29._0_4_ = fVar2 * fVar24;
      fVar31 = auVar25._4_4_;
      auVar29._4_4_ = fVar2 * fVar31;
      fVar32 = auVar25._8_4_;
      auVar29._8_4_ = fVar2 * fVar32;
      fVar33 = auVar25._12_4_;
      auVar29._12_4_ = fVar2 * fVar33;
      auVar36._0_4_ = fVar3 * fVar24;
      auVar36._4_4_ = fVar3 * fVar31;
      auVar36._8_4_ = fVar3 * fVar32;
      auVar36._12_4_ = fVar3 * fVar33;
      auVar19._0_4_ = fVar4 * fVar24;
      auVar19._4_4_ = fVar4 * fVar31;
      auVar19._8_4_ = fVar4 * fVar32;
      auVar19._12_4_ = fVar4 * fVar33;
      hit.vNg.field_0.field_0.x.field_0 = (vfloat_impl<4>)vsubps_avx(auVar29,auVar42);
      hit.vNg.field_0.field_0.y.field_0 = (vfloat_impl<4>)vsubps_avx(auVar36,auVar23);
      hit.vNg.field_0.field_0.z.field_0 = (vfloat_impl<4>)vsubps_avx(auVar19,auVar34);
      uVar15 = (ulong)(uVar10 & 0xff);
      pauVar13 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
      auVar39 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
      do {
        auVar25 = auVar37._0_16_;
        auVar42 = auVar49._0_16_;
        auVar19 = auVar44._0_16_;
        args.hit = (RTCHitN *)local_c8;
        args.valid = (int *)local_228;
        auVar46 = auVar47._0_32_;
        auVar16 = auVar52._0_16_;
        auVar34 = auVar51._0_16_;
        auVar27 = auVar56._0_16_;
        auVar23 = auVar50._0_16_;
        auVar18 = auVar57._0_16_;
        aVar54 = auVar55._0_16_;
        uVar9 = 0;
        if (uVar15 != 0) {
          for (; (uVar15 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
          }
        }
        uVar10 = *(uint *)(local_d8 + uVar9 * 4);
        pGVar5 = (pSVar14->geometries).items[uVar10].ptr;
        args.ray = (RTCRayN *)ray;
        if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (bVar12 = true, pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0))
          goto LAB_007610b5;
          *(float *)(ray + k * 4 + 0x80) = hit.vt.field_0.v[uVar9];
          args.context = context->user;
          local_68 = vpshufd_avx(ZEXT416(uVar10),0);
          local_78 = (sphere->primIDs).field_0.i[uVar9];
          local_c8._4_4_ = *(undefined4 *)((long)&hit.vNg.field_0 + uVar9 * 4);
          uVar1 = *(undefined4 *)((long)&hit.vNg.field_0 + uVar9 * 4 + 0x10);
          local_b8._4_4_ = uVar1;
          local_b8._0_4_ = uVar1;
          local_b8._8_4_ = uVar1;
          local_b8._12_4_ = uVar1;
          local_a8._4_4_ = *(undefined4 *)((long)&hit.vNg.field_0 + uVar9 * 4 + 0x20);
          local_c8._0_4_ = local_c8._4_4_;
          local_c8._8_4_ = local_c8._4_4_;
          local_c8._12_4_ = local_c8._4_4_;
          local_a8._0_4_ = local_a8._4_4_;
          local_a8._8_4_ = local_a8._4_4_;
          local_a8._12_4_ = local_a8._4_4_;
          local_98 = ZEXT432(0) << 0x20;
          auVar46 = vcmpps_avx(ZEXT432(0) << 0x20,ZEXT432(0) << 0x20,0xf);
          auVar26 = auVar46._0_16_;
          uStack_74 = local_78;
          uStack_70 = local_78;
          uStack_6c = local_78;
          uStack_54 = (args.context)->instID[0];
          local_58 = uStack_54;
          uStack_50 = uStack_54;
          uStack_4c = uStack_54;
          uStack_48 = (args.context)->instPrimID[0];
          uStack_44 = uStack_48;
          uStack_40 = uStack_48;
          uStack_3c = uStack_48;
          local_228 = *pauVar13;
          args.geometryUserPtr = pGVar5->userPtr;
          args.N = 4;
          local_1f8 = auVar41._0_16_;
          auVar35 = auVar47._0_16_;
          local_208 = auVar25;
          local_1e0 = pSVar14;
          if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            local_218 = pauVar13;
            (*pGVar5->occlusionFilterN)(&args);
            auVar57 = ZEXT1664(auVar18);
            auVar56 = ZEXT1664(auVar27);
            auVar55 = ZEXT1664((undefined1  [16])aVar54);
            auVar49 = ZEXT1664(auVar42);
            auVar47 = ZEXT1664(auVar35);
            auVar44 = ZEXT1664(auVar19);
            auVar52 = ZEXT1664(auVar16);
            auVar51 = ZEXT1664(auVar34);
            auVar50 = ZEXT1664(auVar23);
            auVar39 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
            auVar41 = ZEXT1664(local_1f8);
            pauVar13 = local_218;
          }
          if (local_228 == (undefined1  [16])0x0) {
            auVar19 = ZEXT816(0);
            auVar25 = vpcmpeqd_avx((undefined1  [16])0x0,auVar19);
            auVar19 = vpcmpeqd_avx(auVar19,auVar19);
            auVar25 = auVar25 ^ auVar19;
          }
          else {
            p_Var8 = context->args->filter;
            auVar20 = ZEXT816(0);
            auVar25 = vpcmpeqd_avx(auVar26,auVar26);
            if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
              local_210 = sphere;
              (*p_Var8)(&args);
              auVar25 = vpcmpeqd_avx(auVar25,auVar25);
              auVar20 = ZEXT816(0) << 0x40;
              auVar57 = ZEXT1664(auVar18);
              auVar56 = ZEXT1664(auVar27);
              auVar55 = ZEXT1664((undefined1  [16])aVar54);
              auVar49 = ZEXT1664(auVar42);
              auVar47 = ZEXT1664(auVar35);
              auVar44 = ZEXT1664(auVar19);
              auVar52 = ZEXT1664(auVar16);
              auVar51 = ZEXT1664(auVar34);
              auVar50 = ZEXT1664(auVar23);
              auVar39 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
              auVar41 = ZEXT1664(local_1f8);
              sphere = local_210;
            }
            auVar19 = vpcmpeqd_avx(local_228,auVar20);
            auVar25 = auVar19 ^ auVar25;
            auVar19 = vblendvps_avx(auVar39._0_16_,*(undefined1 (*) [16])(args.ray + 0x80),auVar19);
            *(undefined1 (*) [16])(args.ray + 0x80) = auVar19;
          }
          auVar42 = auVar49._0_16_;
          auVar19 = auVar44._0_16_;
          auVar46 = auVar47._0_32_;
          auVar16 = auVar52._0_16_;
          auVar34 = auVar51._0_16_;
          auVar27 = auVar56._0_16_;
          auVar23 = auVar50._0_16_;
          auVar18 = auVar57._0_16_;
          aVar54 = auVar55._0_16_;
          auVar37 = ZEXT1664(local_208);
          auVar21._8_8_ = 0x100000001;
          auVar21._0_8_ = 0x100000001;
          if ((auVar21 & auVar25) != (undefined1  [16])0x0) {
            auVar41 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
            bVar12 = true;
            auVar25 = local_208;
            goto LAB_007610b5;
          }
          *(int *)(ray + k * 4 + 0x80) = auVar41._0_4_;
          pSVar14 = local_1e0;
        }
        auVar42 = auVar49._0_16_;
        auVar19 = auVar44._0_16_;
        auVar46 = auVar47._0_32_;
        auVar16 = auVar52._0_16_;
        auVar34 = auVar51._0_16_;
        auVar27 = auVar56._0_16_;
        auVar23 = auVar50._0_16_;
        auVar18 = auVar57._0_16_;
        aVar54 = auVar55._0_16_;
        uVar15 = uVar15 ^ 1L << (uVar9 & 0x3f);
      } while (uVar15 != 0);
      bVar12 = false;
      auVar25 = auVar37._0_16_;
LAB_007610b5:
      local_218 = pauVar13;
      auVar26 = vshufps_avx(auVar41._0_16_,auVar41._0_16_,0);
      auVar26 = vcmpps_avx((undefined1  [16])aVar54,auVar26,2);
      auVar18 = vandps_avx(auVar18,auVar26);
      auVar25 = vandps_avx(auVar18,auVar25);
      uVar10 = vmovmskps_avx(auVar25);
      if (uVar10 == 0) {
        return bVar12;
      }
      fVar2 = auVar27._0_4_;
      auVar17._0_4_ = auVar23._0_4_ * fVar2;
      fVar3 = auVar27._4_4_;
      auVar17._4_4_ = auVar23._4_4_ * fVar3;
      fVar4 = auVar27._8_4_;
      auVar17._8_4_ = auVar23._8_4_ * fVar4;
      fVar24 = auVar27._12_4_;
      auVar17._12_4_ = auVar23._12_4_ * fVar24;
      auVar22._0_4_ = auVar34._0_4_ * fVar2;
      auVar22._4_4_ = auVar34._4_4_ * fVar3;
      auVar22._8_4_ = auVar34._8_4_ * fVar4;
      auVar22._12_4_ = auVar34._12_4_ * fVar24;
      auVar30._0_4_ = auVar16._0_4_ * fVar2;
      auVar30._4_4_ = auVar16._4_4_ * fVar3;
      auVar30._8_4_ = auVar16._8_4_ * fVar4;
      auVar30._12_4_ = auVar16._12_4_ * fVar24;
      hit.vNg.field_0.field_0.x.field_0 = (vfloat_impl<4>)vsubps_avx(auVar17,auVar19);
      hit.vNg.field_0.field_0.y.field_0 = (vfloat_impl<4>)vsubps_avx(auVar22,auVar46._0_16_);
      hit.vNg.field_0.field_0.z.field_0 = (vfloat_impl<4>)vsubps_avx(auVar30,auVar42);
      hit.vt.field_0 = aVar54;
      pSVar14 = context->scene;
      uVar15 = (ulong)(uVar10 & 0xff);
      auVar46 = vcmpps_avx(auVar46,auVar46,0xf);
      auVar44 = ZEXT3264(auVar46);
      auVar47 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar25 = vpcmpeqd_avx(auVar23,auVar23);
      auVar49 = ZEXT1664(auVar25);
      do {
        args.hit = (RTCHitN *)local_c8;
        args.valid = (int *)local_228;
        uVar9 = 0;
        if (uVar15 != 0) {
          for (; (uVar15 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
          }
        }
        uVar10 = *(uint *)(local_d8 + uVar9 * 4);
        pGVar5 = (pSVar14->geometries).items[uVar10].ptr;
        if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (bVar11 = 1, pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_00761395;
          *(float *)(ray + k * 4 + 0x80) = hit.vt.field_0.v[uVar9];
          args.context = context->user;
          local_68 = vpshufd_avx(ZEXT416(uVar10),0);
          local_78 = (sphere->primIDs).field_0.i[uVar9];
          uVar1 = *(undefined4 *)((long)&hit.vNg.field_0 + uVar9 * 4);
          local_c8._4_4_ = uVar1;
          local_c8._0_4_ = uVar1;
          local_c8._8_4_ = uVar1;
          local_c8._12_4_ = uVar1;
          uVar1 = *(undefined4 *)((long)&hit.vNg.field_0 + uVar9 * 4 + 0x10);
          local_b8._4_4_ = uVar1;
          local_b8._0_4_ = uVar1;
          local_b8._8_4_ = uVar1;
          local_b8._12_4_ = uVar1;
          uVar1 = *(undefined4 *)((long)&hit.vNg.field_0 + uVar9 * 4 + 0x20);
          local_a8._4_4_ = uVar1;
          local_a8._0_4_ = uVar1;
          local_a8._8_4_ = uVar1;
          local_a8._12_4_ = uVar1;
          local_98 = ZEXT1632(ZEXT816(0));
          uStack_74 = local_78;
          uStack_70 = local_78;
          uStack_6c = local_78;
          uStack_54 = (args.context)->instID[0];
          local_58 = uStack_54;
          uStack_50 = uStack_54;
          uStack_4c = uStack_54;
          uStack_48 = (args.context)->instPrimID[0];
          uStack_44 = uStack_48;
          uStack_40 = uStack_48;
          uStack_3c = uStack_48;
          local_228 = *local_218;
          args.geometryUserPtr = pGVar5->userPtr;
          args.N = 4;
          local_1f8 = auVar41._0_16_;
          local_208._0_8_ = pSVar14;
          args.ray = (RTCRayN *)ray;
          if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            auVar46 = ZEXT1632(auVar44._0_16_);
            auVar25 = auVar49._0_16_;
            local_210 = sphere;
            (*pGVar5->occlusionFilterN)(&args);
            auVar25 = vpcmpeqd_avx(auVar25,auVar25);
            auVar49 = ZEXT1664(auVar25);
            auVar47 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar46 = vcmpps_avx(auVar46,auVar46,0xf);
            auVar44 = ZEXT3264(auVar46);
            auVar39 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
            auVar41 = ZEXT1664(local_1f8);
            sphere = local_210;
            pSVar14 = (Scene *)local_208._0_8_;
          }
          auVar25 = auVar49._0_16_;
          if (local_228 == (undefined1  [16])0x0) {
            auVar19 = vpcmpeqd_avx(auVar47._0_16_,(undefined1  [16])0x0);
            auVar25 = auVar25 ^ auVar19;
          }
          else {
            p_Var8 = context->args->filter;
            if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
              auVar46 = ZEXT1632(auVar44._0_16_);
              (*p_Var8)(&args);
              auVar25 = vpcmpeqd_avx(auVar25,auVar25);
              auVar49 = ZEXT1664(auVar25);
              auVar47 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar46 = vcmpps_avx(auVar46,auVar46,0xf);
              auVar44 = ZEXT3264(auVar46);
              auVar39 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
              auVar41 = ZEXT1664(local_1f8);
              pSVar14 = (Scene *)local_208._0_8_;
            }
            auVar19 = vpcmpeqd_avx(auVar47._0_16_,local_228);
            auVar25 = auVar49._0_16_ ^ auVar19;
            auVar19 = vblendvps_avx(auVar39._0_16_,*(undefined1 (*) [16])(args.ray + 0x80),auVar19);
            *(undefined1 (*) [16])(args.ray + 0x80) = auVar19;
          }
          auVar23._8_8_ = 0x100000001;
          auVar23._0_8_ = 0x100000001;
          if ((auVar23 & auVar25) != (undefined1  [16])0x0) {
            bVar11 = 1;
            goto LAB_00761395;
          }
          *(int *)(ray + k * 4 + 0x80) = auVar41._0_4_;
        }
        uVar15 = uVar15 ^ 1L << (uVar9 & 0x3f);
        if (uVar15 == 0) {
          bVar11 = 0;
LAB_00761395:
          return (bool)(bVar12 | bVar11);
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(
          const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& sphere)
      {
        STAT3(shadow.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(sphere.geomID());
        Vec4vf<M> v0; sphere.gather(v0, geom);
        const vbool<M> valid = sphere.valid();
        return SphereIntersectorK<M, K>::intersect(
          valid, ray, k, context, geom, pre, v0,
          Occluded1KEpilogM<M, K, filter>(ray, k, context, sphere.geomID(), sphere.primID()));
      }